

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsStatus __thiscall Highs::deleteRows(Highs *this,HighsInt from_row,HighsInt to_row)

{
  HighsInt HVar1;
  HighsStatus HVar2;
  HighsIndexCollection index_collection;
  HighsIndexCollection local_70;
  
  clearDerivedModelProperties(this);
  local_70.dimension_ = -1;
  local_70.is_interval_ = false;
  local_70.from_ = -1;
  local_70.to_ = -2;
  local_70.is_set_ = false;
  local_70.set_num_entries_ = -1;
  local_70.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_70.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_70.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_70.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_70.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = 0;
  local_70.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._1_7_ = 0;
  local_70.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_70._41_8_ = 0;
  HVar1 = create(&local_70,from_row,to_row,(this->model_).lp_.num_row_);
  if (HVar1 == 0) {
    deleteRowsInterface(this,&local_70);
    HVar2 = returnFromHighs(this,kOk);
  }
  else {
    HVar2 = kError;
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "Interval [%d, %d] supplied to Highs::deleteRows is out of range [0, %d)\n",
                 (ulong)(uint)from_row,(ulong)(uint)to_row,(ulong)(uint)(this->model_).lp_.num_row_)
    ;
  }
  if (local_70.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.mask_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_70.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.set_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return HVar2;
}

Assistant:

HighsStatus Highs::deleteRows(const HighsInt from_row, const HighsInt to_row) {
  clearDerivedModelProperties();
  HighsIndexCollection index_collection;
  const HighsInt create_error =
      create(index_collection, from_row, to_row, model_.lp_.num_row_);
  if (create_error) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Interval [%d, %d] supplied to Highs::deleteRows is out of "
                 "range [0, %d)\n",
                 int(from_row), int(to_row), int(model_.lp_.num_row_));
    return HighsStatus::kError;
  }
  deleteRowsInterface(index_collection);
  return returnFromHighs(HighsStatus::kOk);
}